

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QList<int> * __thiscall
QDockAreaLayoutInfo::indexOfPlaceHolder(QDockAreaLayoutInfo *this,QString *objectName)

{
  bool bVar1;
  QString *rhs;
  qsizetype qVar2;
  const_reference pQVar3;
  QDockAreaLayoutInfo *in_RDX;
  long in_RSI;
  QList<QDockAreaLayoutItem> *in_RDI;
  QDockAreaLayoutItem *item;
  int i;
  QList<int> *result;
  parameter_type pVar4;
  QList<QDockAreaLayoutItem> *this_00;
  int local_30;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  
  iVar5 = 0;
  this_00 = in_RDI;
  do {
    rhs = (QString *)(long)iVar5;
    qVar2 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RSI + 0x40));
    if (qVar2 <= (long)rhs) {
      memset(this_00,0,0x18);
      QList<int>::QList((QList<int> *)0x5728b8);
      return (QList<int> *)in_RDI;
    }
    pQVar3 = QList<QDockAreaLayoutItem>::at(this_00,(qsizetype)rhs);
    if (pQVar3->subinfo == (QDockAreaLayoutInfo *)0x0) {
      if (pQVar3->placeHolderItem != (QPlaceHolderItem *)0x0) {
        bVar1 = ::operator==((QString *)this_00,rhs);
        pVar4 = (parameter_type)((ulong)rhs >> 0x20);
        if (bVar1) {
          (this_00->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          (this_00->d).ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
          (this_00->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QList<int>::QList((QList<int> *)0x57285d);
          QList<int>::operator<<((QList<int> *)this_00,pVar4);
          return (QList<int> *)in_RDI;
        }
      }
    }
    else {
      (this_00->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (this_00->d).ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
      (this_00->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      indexOfPlaceHolder(in_RDX,(QString *)CONCAT44(iVar5,in_stack_ffffffffffffffe0));
      pVar4 = (parameter_type)((ulong)rhs >> 0x20);
      bVar1 = QList<int>::isEmpty((QList<int> *)0x5727bb);
      if (bVar1) {
        local_30 = 4;
        QList<int>::~QList((QList<int> *)0x5727f5);
      }
      else {
        QList<int>::prepend((QList<int> *)0x5727cd,pVar4);
        local_30 = 1;
      }
      if (local_30 == 1) {
        return (QList<int> *)in_RDI;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

QList<int> QDockAreaLayoutInfo::indexOfPlaceHolder(const QString &objectName) const
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);

        if (item.subinfo != nullptr) {
            QList<int> result = item.subinfo->indexOfPlaceHolder(objectName);
            if (!result.isEmpty()) {
                result.prepend(i);
                return result;
            }
            continue;
        }

        if (item.placeHolderItem != nullptr && item.placeHolderItem->objectName == objectName) {
            QList<int> result;
            result << i;
            return result;
        }
    }

    return QList<int>();
}